

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnHostAdminPMessage
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  bool bVar1;
  __sv_type _Var2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  code *local_108;
  size_t local_e8;
  char *local_e0;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  undefined1 local_60 [8];
  string msg;
  logFuncType func;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view message_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x10 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_60,&this->pAdminMsgFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if (!bVar1) {
    RenX::processTags((string *)local_60,server,(PlayerInfo *)0x0,player,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x208))
    ;
    bVar3 = sv("Host",4);
    local_80 = _Var2._M_len;
    local_78 = _Var2._M_str;
    local_90 = bVar3._M_len;
    local_88 = bVar3._M_str;
    RenX::replace_tag(local_60,local_80,local_78,local_90,local_88);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x228))
    ;
    bVar3 = sv("Host",4);
    local_a0 = _Var2._M_len;
    local_98 = _Var2._M_str;
    local_b0 = bVar3._M_len;
    local_a8 = bVar3._M_str;
    RenX::replace_tag(local_60,local_a0,local_98,local_b0,local_a8);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x1508));
    local_c0 = _Var2._M_len;
    local_b8 = _Var2._M_str;
    RenX::replace_tag(local_60,local_c0,local_b8,message._M_len,message._M_str);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_108 = (code *)msg.field_2._8_8_;
    }
    else {
      local_108 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_e8 = _Var2._M_len;
    local_e0 = _Var2._M_str;
    (*local_108)(server,local_e8,local_e0);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnHostAdminPMessage(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::adminPMessagePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->pAdminMsgFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, nullptr, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_NAME_TAG, "Host"sv);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_RAW_NAME_TAG, "Host"sv);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}